

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_4,_2> *
deqp::gles3::Functional::MatrixCaseUtils::negate<float,4,2>(Matrix<float,_4,_2> *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vector<float,_4> *pVVar4;
  Matrix<float,_4,_2> *retVal;
  Matrix<float,_4,_2> *in_RDI;
  
  (in_RDI->m_data).m_data[0].m_data[0] = 1.0;
  (in_RDI->m_data).m_data[0].m_data[1] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[2] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[3] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[1] = 1.0;
  pVVar4 = (in_RDI->m_data).m_data;
  pVVar4[1].m_data[2] = 0.0;
  pVVar4[1].m_data[3] = 0.0;
  fVar1 = (mat->m_data).m_data[0].m_data[1];
  fVar2 = (mat->m_data).m_data[0].m_data[2];
  fVar3 = (mat->m_data).m_data[0].m_data[3];
  (in_RDI->m_data).m_data[0].m_data[0] = -(mat->m_data).m_data[0].m_data[0];
  (in_RDI->m_data).m_data[0].m_data[1] = -fVar1;
  (in_RDI->m_data).m_data[0].m_data[2] = -fVar2;
  (in_RDI->m_data).m_data[0].m_data[3] = -fVar3;
  fVar1 = (mat->m_data).m_data[1].m_data[1];
  fVar2 = (mat->m_data).m_data[1].m_data[2];
  fVar3 = (mat->m_data).m_data[1].m_data[3];
  (in_RDI->m_data).m_data[1].m_data[0] = -(mat->m_data).m_data[1].m_data[0];
  (in_RDI->m_data).m_data[1].m_data[1] = -fVar1;
  (in_RDI->m_data).m_data[1].m_data[2] = -fVar2;
  (in_RDI->m_data).m_data[1].m_data[3] = -fVar3;
  return in_RDI;
}

Assistant:

tcu::Matrix<T, Rows, Cols> negate (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = -mat(r, c);

	return retVal;
}